

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void WriteArrayVars(FILE *file,FWorldGlobalArray *vars,uint count,DWORD id)

{
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this;
  uint uVar1;
  long lVar2;
  bool bVar3;
  hash_t hVar4;
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *pTVar5;
  uint uVar6;
  Pair *pair;
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this_00;
  uint count_00;
  ulong uVar7;
  ulong uVar8;
  FWorldGlobalArray *this_01;
  FPNGChunkArchive arc;
  FPNGChunkArchive local_330;
  
  if (count == 0) {
    return;
  }
  uVar8 = 0;
  this_01 = vars;
  while (hVar4 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this_01), hVar4 == 0) {
    uVar8 = uVar8 + 1;
    this_01 = this_01 + 1;
    if (count == uVar8) {
      return;
    }
  }
  uVar7 = (ulong)(count - 1);
  this_00 = vars + uVar7;
  do {
    count_00 = (uint)uVar7;
    uVar6 = (uint)uVar8;
    if (count_00 <= uVar6) break;
    hVar4 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this_00);
    this_00 = this_00 + -1;
    uVar7 = (ulong)(count_00 - 1);
  } while (hVar4 == 0);
  FPNGChunkArchive::FPNGChunkArchive(&local_330,file,id);
  FArchive::WriteCount(&local_330.super_FArchive,uVar6);
  FArchive::WriteCount(&local_330.super_FArchive,count_00);
  if (count_00 < uVar6) {
LAB_004d2ad6:
    FPNGChunkArchive::~FPNGChunkArchive(&local_330);
    return;
  }
LAB_004d2a42:
  this = vars + (uVar8 & 0xffffffff);
  hVar4 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this);
  FArchive::WriteCount(&local_330.super_FArchive,hVar4);
  uVar6 = 0;
  do {
    uVar1 = this->Size;
    if (uVar6 < uVar1) {
      pTVar5 = (TMap<int,_int,_THashTraits<int>,_InitIntToZero> *)&this->Nodes[uVar6].Pair;
      do {
        uVar6 = uVar6 + 1;
        lVar2._0_4_ = pTVar5[-1].Size;
        lVar2._4_4_ = pTVar5[-1].NumUsed;
        if (lVar2 != 1) {
          bVar3 = true;
          this_00 = pTVar5;
          goto LAB_004d2aae;
        }
        pTVar5 = (TMap<int,_int,_THashTraits<int>,_InitIntToZero> *)&pTVar5->Size;
      } while (uVar6 != uVar1);
      bVar3 = false;
      uVar6 = uVar1;
    }
    else {
      bVar3 = false;
    }
LAB_004d2aae:
    if (!bVar3) break;
    FArchive::WriteCount(&local_330.super_FArchive,*(DWORD *)&this_00->Nodes);
    FArchive::WriteCount(&local_330.super_FArchive,*(int *)((long)&this_00->Nodes + 4));
  } while( true );
  uVar6 = (int)uVar8 + 1;
  uVar8 = (ulong)uVar6;
  if (count_00 < uVar6) goto LAB_004d2ad6;
  goto LAB_004d2a42;
}

Assistant:

static void WriteArrayVars (FILE *file, FWorldGlobalArray *vars, unsigned int count, DWORD id)
{
	unsigned int i, j;

	// Find the first non-empty array.
	for (i = 0; i < count; ++i)
	{
		if (vars[i].CountUsed() != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-empty array. Anything beyond the last stored array
		// will be emptied at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j].CountUsed() != 0)
				break;
		}
		FPNGChunkArchive arc (file, id);
		arc.WriteCount (i);
		arc.WriteCount (j);
		for (; i <= j; ++i)
		{
			arc.WriteCount (vars[i].CountUsed());

			FWorldGlobalArray::ConstIterator it(vars[i]);
			const FWorldGlobalArray::Pair *pair;

			while (it.NextPair (pair))
			{
				arc.WriteCount (pair->Key);
				arc.WriteCount (pair->Value);
			}
		}
	}
}